

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<int,_false,_5> __thiscall
immutable::vector<int,_false,_5>::insert
          (vector<int,_false,_5> *this,size_type_conflict pos,value_type value)

{
  undefined4 in_register_00000034;
  vector<int,_false,_5> local_48 [3];
  vector<int,_false,_5> local_30;
  vector<int,_false,_5> local_28;
  value_type local_1c;
  value_type value_local;
  size_type_conflict pos_local;
  vector<int,_false,_5> *this_local;
  
  _value_local = CONCAT44(in_register_00000034,pos);
  local_1c = value;
  this_local = this;
  take(&local_30,pos);
  push_back(&local_28,(value_type)&local_30);
  drop(local_48,pos);
  operator+((immutable *)this,&local_28,local_48);
  ~vector(local_48);
  ~vector(&local_28);
  ~vector(&local_30);
  return (vector<int,_false,_5>)(ref<immutable::rrb<int,_false,_5>_>)this;
}

Assistant:

vector insert(size_type pos, value_type value) const
        {        
        return take(pos).push_back(value) + drop(pos);
        }